

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

FILE * openFile(wstring *fileName,OpenFileMode mode)

{
  FILE *pFVar1;
  char *__modes;
  string nameUtf8;
  string local_28;
  
  convertWStringToUtf8(&local_28,fileName);
  if (mode == ReadWriteBinary) {
    __modes = "rb+";
  }
  else if (mode == WriteBinary) {
    __modes = "wb";
  }
  else {
    if (mode != ReadBinary) {
      pFVar1 = (FILE *)0x0;
      goto LAB_0012e123;
    }
    __modes = "rb";
  }
  pFVar1 = fopen(local_28._M_dataplus._M_p,__modes);
LAB_0012e123:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE* openFile(const std::wstring& fileName, OpenFileMode mode)
{
#ifdef _WIN32
	switch (mode)
	{
	case OpenFileMode::ReadBinary:
		return _wfopen(fileName.c_str(),L"rb");
	case OpenFileMode::WriteBinary:
		return _wfopen(fileName.c_str(),L"wb");
	case OpenFileMode::ReadWriteBinary:
		return _wfopen(fileName.c_str(),L"rb+");
	}
#else
	std::string nameUtf8 = convertWStringToUtf8(fileName);
	
	switch (mode)
	{
	case OpenFileMode::ReadBinary:
		return fopen(nameUtf8.c_str(),"rb");
	case OpenFileMode::WriteBinary:
		return fopen(nameUtf8.c_str(),"wb");
	case OpenFileMode::ReadWriteBinary:
		return fopen(nameUtf8.c_str(),"rb+");
	}
#endif

	return NULL;
}